

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# clufactor.hpp
# Opt level: O2

void __thiscall soplex::CLUFactor<double>::Temp::~Temp(Temp *this)

{
  clear(this);
  std::_Vector_base<double,_std::allocator<double>_>::~_Vector_base
            (&(this->s_max).super__Vector_base<double,_std::allocator<double>_>);
  return;
}

Assistant:

CLUFactor<R>::Temp::~Temp()
{
   clear();
}